

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_dophase_done(Curl_easy *data,_Bool connected)

{
  IMAP *pIVar1;
  CURLcode CVar2;
  
  pIVar1 = (data->req).p.imap;
  if (pIVar1->transfer == PPTRANSFER_BODY) {
    return (CURLcode)pIVar1;
  }
  CVar2 = CURLE_OK;
  xfer_setup(data,-1,-1,false,-1,false,false);
  return CVar2;
}

Assistant:

static CURLcode imap_dophase_done(struct Curl_easy *data, bool connected)
{
  struct IMAP *imap = data->req.p.imap;

  (void)connected;

  if(imap->transfer != PPTRANSFER_BODY)
    /* no data to transfer */
    Curl_xfer_setup_nop(data);

  return CURLE_OK;
}